

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O1

void __thiscall
FIX::ThreadedSocketInitiator::removeThread(ThreadedSocketInitiator *this,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  
  Mutex::lock(&this->m_mutex);
  p_Var1 = &(this->m_threads)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < s]) {
    if (s <= (int)p_Var3[1]._M_color) {
      p_Var4 = p_Var3;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position._M_node = p_Var4, s < (int)p_Var4[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    thread_detach((thread_id)__position._M_node[1]._M_parent);
    std::
    _Rb_tree<int,std::pair<int_const,unsigned_long>,std::_Select1st<std::pair<int_const,unsigned_long>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,unsigned_long>,std::_Select1st<std::pair<int_const,unsigned_long>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>
                        *)&this->m_threads,__position);
  }
  iVar2 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar2 + -1;
  if (1 < iVar2) {
    return;
  }
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ThreadedSocketInitiator::removeThread(socket_handle s )
{
  Locker l(m_mutex);
  SocketToThread::iterator i = m_threads.find( s );

  if ( i != m_threads.end() )
  {
    thread_detach( i->second );
    m_threads.erase( i );
  }
}